

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::handleLoopAttributes
          (HlslParseContext *this,TSourceLoc *loc,TIntermLoop *loop,TAttributes *attributes)

{
  bool bVar1;
  pointer pTVar2;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  TAttributes *attributes_local;
  TIntermLoop *loop_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  if (loop != (TIntermLoop *)0x0) {
    it._M_node = (_List_node_base *)attributes;
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::begin
                   (&attributes->
                     super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                   );
    while( true ) {
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::end
                     (it._M_node);
      bVar1 = std::operator!=(&local_30,&local_38);
      if (!bVar1) break;
      pTVar2 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_30);
      if (pTVar2->name == EatUnroll) {
        TIntermLoop::setUnroll(loop);
      }
      else if (pTVar2->name == EatLoop) {
        TIntermLoop::setDontUnroll(loop);
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                  (this,loc,"attribute does not apply to a loop","");
      }
      std::_List_const_iterator<glslang::TAttributeArgs>::operator++(&local_30);
    }
  }
  return;
}

Assistant:

void HlslParseContext::handleLoopAttributes(const TSourceLoc& loc, TIntermLoop* loop,
    const TAttributes& attributes)
{
    if (loop == nullptr)
        return;

    for (auto it = attributes.begin(); it != attributes.end(); ++it) {
        switch (it->name) {
        case EatUnroll:
            loop->setUnroll();
            break;
        case EatLoop:
            loop->setDontUnroll();
            break;
        default:
            warn(loc, "attribute does not apply to a loop", "", "");
            break;
        }
    }
}